

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openjpeg.c
# Opt level: O0

void opj_set_default_encoder_parameters(opj_cparameters_t *parameters)

{
  void *in_RDI;
  
  if (in_RDI != (void *)0x0) {
    memset(in_RDI,0,0x4910);
    *(undefined4 *)((long)in_RDI + 0x48fc) = 0;
    *(undefined4 *)((long)in_RDI + 0x4900) = 0;
    *(undefined4 *)((long)in_RDI + 0x15e0) = 6;
    *(undefined4 *)((long)in_RDI + 0x4904) = 0;
    *(undefined4 *)((long)in_RDI + 0x15e4) = 0x40;
    *(undefined4 *)((long)in_RDI + 0x15e8) = 0x40;
    *(undefined4 *)((long)in_RDI + 0x34) = 0;
    *(undefined4 *)((long)in_RDI + 0x15f4) = 0xffffffff;
    *(undefined4 *)((long)in_RDI + 0x4714) = 1;
    *(undefined4 *)((long)in_RDI + 0x4718) = 1;
    *(undefined1 *)((long)in_RDI + 0x4908) = 0;
    *(undefined4 *)((long)in_RDI + 0x471c) = 0xffffffff;
    *(undefined4 *)((long)in_RDI + 0x4720) = 0xffffffff;
    *(undefined4 *)((long)in_RDI + 0x12c0) = 0;
    *(undefined4 *)((long)in_RDI + 0x12bc) = 0;
    *(undefined4 *)((long)in_RDI + 0x14) = 0;
    *(undefined4 *)((long)in_RDI + 0x18) = 0;
    *(undefined4 *)((long)in_RDI + 0x1c) = 0;
    *(undefined4 *)((long)in_RDI + 0x490c) = 0;
  }
  return;
}

Assistant:

void OPJ_CALLCONV opj_set_default_encoder_parameters(opj_cparameters_t *parameters) {
	if(parameters) {
		memset(parameters, 0, sizeof(opj_cparameters_t));
		/* default coding parameters */
		parameters->cp_cinema = OFF; 
		parameters->max_comp_size = 0;
		parameters->numresolution = 6;
		parameters->cp_rsiz = STD_RSIZ;
		parameters->cblockw_init = 64;
		parameters->cblockh_init = 64;
		parameters->prog_order = LRCP;
		parameters->roi_compno = -1;		/* no ROI */
		parameters->subsampling_dx = 1;
		parameters->subsampling_dy = 1;
		parameters->tp_on = 0;
		parameters->decod_format = -1;
		parameters->cod_format = -1;
		parameters->tcp_rates[0] = 0;   
		parameters->tcp_numlayers = 0;
		parameters->cp_disto_alloc = 0;
		parameters->cp_fixed_alloc = 0;
		parameters->cp_fixed_quality = 0;
		parameters->jpip_on = OPJ_FALSE;
/* UniPG>> */
#ifdef USE_JPWL
		parameters->jpwl_epc_on = OPJ_FALSE;
		parameters->jpwl_hprot_MH = -1; /* -1 means unassigned */
		{
			int i;
			for (i = 0; i < JPWL_MAX_NO_TILESPECS; i++) {
				parameters->jpwl_hprot_TPH_tileno[i] = -1; /* unassigned */
				parameters->jpwl_hprot_TPH[i] = 0; /* absent */
			}
		};
		{
			int i;
			for (i = 0; i < JPWL_MAX_NO_PACKSPECS; i++) {
				parameters->jpwl_pprot_tileno[i] = -1; /* unassigned */
				parameters->jpwl_pprot_packno[i] = -1; /* unassigned */
				parameters->jpwl_pprot[i] = 0; /* absent */
			}
		};
		parameters->jpwl_sens_size = 0; /* 0 means no ESD */
		parameters->jpwl_sens_addr = 0; /* 0 means auto */
		parameters->jpwl_sens_range = 0; /* 0 means packet */
		parameters->jpwl_sens_MH = -1; /* -1 means unassigned */
		{
			int i;
			for (i = 0; i < JPWL_MAX_NO_TILESPECS; i++) {
				parameters->jpwl_sens_TPH_tileno[i] = -1; /* unassigned */
				parameters->jpwl_sens_TPH[i] = -1; /* absent */
			}
		};
#endif /* USE_JPWL */
/* <<UniPG */
	}
}